

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

string * __thiscall google::StrError_abi_cxx11_(string *__return_storage_ptr__,google *this,int err)

{
  int iVar1;
  size_t sVar2;
  char local_88 [8];
  char buf [100];
  
  iVar1 = posix_strerror_r((int)this,local_88,100);
  if ((iVar1 < 0) || (local_88[0] == '\0')) {
    snprintf(local_88,100,"Error number %d",(ulong)this & 0xffffffff);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(local_88);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_88,local_88 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

string StrError(int err) {
  char buf[100];
  int rc = posix_strerror_r(err, buf, sizeof(buf));
  if ((rc < 0) || (buf[0] == '\000')) {
    snprintf(buf, sizeof(buf), "Error number %d", err);
  }
  return buf;
}